

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.c
# Opt level: O0

void lexer_error(char *m,char *s,uint row,uint col)

{
  undefined1 *puVar1;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 *puVar5;
  long lVar6;
  undefined1 *puVar7;
  ulong uVar8;
  undefined8 uStack_70;
  undefined1 auStack_68 [8];
  long local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  ulong local_40;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  size_t local_28;
  size_t len;
  uint col_local;
  uint row_local;
  char *s_local;
  char *m_local;
  
  uStack_70 = 0x10367f;
  len._0_4_ = col;
  len._4_4_ = row;
  _col_local = s;
  s_local = m;
  local_28 = strlen(s);
  __vla_expr1 = (unsigned_long)((uint)len + 2);
  uVar4 = __vla_expr1 + 0xf & 0xfffffffffffffff0;
  lVar6 = -uVar4;
  puVar5 = auStack_68 + lVar6;
  local_60 = -uVar4;
  uVar3 = (uint)len + 2;
  local_58 = auStack_68;
  local_50 = puVar5;
  __vla_expr0 = (unsigned_long)auStack_68;
  *(undefined8 *)(auStack_68 + lVar6 + -8) = 0x1036c6;
  memset(puVar5,0,(ulong)uVar3);
  local_58[local_60] = 10;
  puVar7 = local_50 + 1;
  uVar4 = (ulong)(uint)len;
  *(undefined8 *)(auStack_68 + lVar6 + -8) = 0x1036e8;
  memset(puVar7,0x20,uVar4);
  local_50[(uint)len] = 0x5e;
  local_40 = (ulong)(uint)len;
  puVar5 = puVar5 + -(local_40 + 0xf & 0xfffffffffffffff0);
  local_48 = puVar5;
  if (local_28 < (uint)len) {
    lVar6 = (uint)len - local_28;
    *(undefined8 *)(puVar5 + -8) = 0x103736;
    memset(puVar5,0x20,lVar6 + 1);
  }
  pcVar2 = s_local;
  uVar4 = (ulong)len._4_4_;
  uVar8 = (ulong)(uint)len;
  *(undefined8 *)(puVar5 + -8) = 0x103759;
  fprintf(_stderr,"%s:(%d, %d)\n",pcVar2,uVar4,uVar8);
  pcVar2 = _col_local;
  puVar1 = local_48;
  puVar7 = local_50;
  *(undefined8 *)(puVar5 + -8) = 0x10377d;
  fprintf(_stderr,"%s%s%s\n",puVar1,pcVar2,puVar7);
  *(undefined8 *)(puVar5 + -8) = 0x103787;
  exit(1);
}

Assistant:

void lexer_error(const char *m, const char *s, unsigned int row, unsigned int col) {
    size_t len = strlen(s);
    char buff[col + 2];
    memset(buff, '\0', col + 2);
    memset(buff, '\n', 1);
    memset(buff + 1, ' ', col);
    memset(buff + col, '^', 1);
    char n_buff[col];
    if (col > len) {
        memset(n_buff, ' ', col - len + 1);
    }
    fprintf(stderr, "%s:(%d, %d)\n", m, row, col);
    fprintf(stderr, "%s%s%s\n", n_buff, s, buff);
    exit(1);
}